

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPM2B_CONTEXT_DATA_Marshal(TPM2B_CONTEXT_DATA *source,BYTE **buffer,INT32 *size)

{
  ushort uVar1;
  UINT16 UVar2;
  
  UINT16_Marshal((UINT16 *)source,buffer,size);
  uVar1 = (source->t).size;
  if (uVar1 == 0) {
    UVar2 = 2;
  }
  else {
    if ((buffer != (BYTE **)0x0) &&
       ((size == (INT32 *)0x0 || (*size = *size - (uint)uVar1, -1 < *size)))) {
      memcpy(*buffer,(source->t).buffer,(ulong)uVar1);
      *buffer = *buffer + uVar1;
    }
    UVar2 = uVar1 + 2;
  }
  return UVar2;
}

Assistant:

UINT16
TPM2B_CONTEXT_DATA_Marshal(TPM2B_CONTEXT_DATA *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT16_Marshal((UINT16 *)&(source->t.size), buffer, size));
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(source->t.size == 0)
        return result;
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->t.buffer), buffer, size, (INT32)(source->t.size)));
    return result;
}